

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6)

{
  Data *this_00;
  bool bVar1;
  undefined2 local_1e;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined2 local_18;
  OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if (((((DAT_0159efbd == '\0') && (local_1e = (undefined2)R0, R0 < 0x10000)) &&
       (local_1c = (undefined2)R1, R1 < 0x10000)) &&
      ((local_1a = (undefined2)R2, R2 < 0x10000 && (local_18 = (undefined2)R3, R3 < 0x10000)))) &&
     ((layout.R0 = (RegSlotType)R4, R4 < 0x10000 &&
      ((layout.R1 = (RegSlotType)R5, R5 < 0x10000 && (layout.R2 = (RegSlotType)R6, R6 < 0x10000)))))
     ) {
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,&local_1e,0xe);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg7(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6)
    {
        OpLayoutT_AsmReg7<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.R4, R4) && SizePolicy::Assign(layout.R5, R5) && SizePolicy::Assign(layout.R6, R6))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }